

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean rob_shop(monst *shkp)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long local_28;
  long total;
  eshk *eshkp;
  monst *shkp_local;
  
  rouse_shk(shkp,'\x01');
  local_28 = addupbill(shkp);
  local_28 = local_28 + *(int *)&shkp[0x1b].field_0x60;
  if ((int)shkp[0x1b].mappearance < local_28) {
    pline("You escaped the shop without paying!");
    local_28 = local_28 - (int)shkp[0x1b].mappearance;
  }
  else {
    uVar1 = shkp[0x1b].mappearance;
    pcVar3 = currency((long)(int)shkp[0x1b].mappearance);
    pline("Your credit of %ld %s is used to cover your shopping bill.",(ulong)uVar1,pcVar3);
    local_28 = 0;
  }
  setpaid(shkp);
  if (local_28 == 0) {
    shkp_local._7_1_ = '\0';
  }
  else {
    *(int *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame + (int)local_28;
    pcVar3 = currency(local_28);
    pline("You stole %ld %s worth of merchandise.",local_28,pcVar3);
    if (urole.malenum != 0x164) {
      iVar2 = sgn((int)u.ualign.type);
      adjalign(-iVar2);
    }
    hot_pursuit(shkp);
    shkp_local._7_1_ = '\x01';
  }
  return shkp_local._7_1_;
}

Assistant:

static boolean rob_shop(struct monst *shkp)
{
	struct eshk *eshkp;
	long total;

	eshkp = ESHK(shkp);
	rouse_shk(shkp, TRUE);
	total = (addupbill(shkp) + eshkp->debit);
	if (eshkp->credit >= total) {
	    pline("Your credit of %ld %s is used to cover your shopping bill.",
		 eshkp->credit, currency(eshkp->credit));
	    total = 0L;		/* credit gets cleared by setpaid() */
	} else {
	    pline("You escaped the shop without paying!");
	    total -= eshkp->credit;
	}
	setpaid(shkp);
	if (!total) return FALSE;

	/* by this point, we know an actual robbery has taken place */
	eshkp->robbed += total;
	pline("You stole %ld %s worth of merchandise.",
	    total, currency(total));
	if (!Role_if (PM_ROGUE))	/* stealing is unlawful */
	    adjalign(-sgn(u.ualign.type));

	hot_pursuit(shkp);
	return TRUE;
}